

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void safe_fprintf(FILE *f,char *fmt,...)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *in_RSI;
  FILE *in_RDI;
  char try_wc;
  wchar_t wc;
  uint i;
  char *p;
  va_list ap;
  wchar_t n;
  wchar_t length;
  wchar_t fmtbuff_length;
  char *fmtbuff;
  char *fmtbuff_heap;
  char outbuff [256];
  char fmtbuff_stack [256];
  char c;
  size_t in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  wchar_t local_268;
  uint local_264;
  char *local_260;
  undefined4 local_258;
  undefined4 local_254;
  undefined1 *local_250;
  undefined1 *local_248;
  int local_234;
  int local_230;
  int local_22c;
  char *local_228;
  char *local_220;
  char local_218 [256];
  char local_118 [264];
  char *local_10;
  FILE *local_8;
  
  local_220 = (char *)0x0;
  local_22c = 0x100;
  local_228 = local_118;
  local_248 = &stack0xfffffffffffffcd8;
  local_250 = &stack0x00000008;
  local_254 = 0x30;
  local_258 = 0x10;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_230 = vsnprintf(local_228,0x100,in_RSI,&local_258);
  do {
    c = local_230 < 0 || local_22c <= local_230;
    if (local_230 >= 0 && local_22c > local_230) {
LAB_00113547:
      iVar3 = mbtowc((wchar_t *)0x0,(char *)0x0,1);
      if (iVar3 == -1) {
        free(local_220);
      }
      else {
        local_260 = local_228;
        local_264 = 0;
        bVar2 = true;
        while (*local_260 != '\0') {
          if ((bVar2) && (local_234 = mbtowc(&local_268,local_260,(long)local_230), local_234 != -1)
             ) {
            local_230 = local_230 - local_234;
            iVar3 = iswprint(local_268);
            if ((iVar3 == 0) || (local_268 == L'\\')) {
              while (iVar3 = local_234 + -1, bVar1 = 0 < local_234, local_234 = iVar3, bVar1) {
                local_260 = local_260 + 1;
                sVar4 = bsdtar_expand_char(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,c);
                local_264 = (int)sVar4 + local_264;
              }
            }
            else {
              while (iVar3 = local_234 + -1, bVar1 = 0 < local_234, local_234 = iVar3, bVar1) {
                local_218[local_264] = *local_260;
                local_264 = local_264 + 1;
                local_260 = local_260 + 1;
              }
            }
          }
          else {
            local_260 = local_260 + 1;
            sVar4 = bsdtar_expand_char(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,c);
            local_264 = (int)sVar4 + local_264;
            bVar2 = false;
          }
          if (0xec < local_264) {
            local_218[local_264] = '\0';
            fprintf(local_8,"%s",local_218);
            local_264 = 0;
          }
        }
        local_218[local_264] = '\0';
        fprintf(local_8,"%s",local_218);
        free(local_220);
      }
      return;
    }
    if (local_230 < local_22c) {
      if (local_22c < 0x2000) {
        local_22c = local_22c << 1;
      }
      else {
        if (999999 < local_22c) {
          local_230 = local_22c;
          local_220[local_22c + -1] = '\0';
          goto LAB_00113547;
        }
        local_22c = local_22c / 4 + local_22c;
      }
    }
    else {
      local_22c = local_230 + 1;
    }
    free(local_220);
    local_220 = (char *)malloc((long)local_22c);
    if (local_220 == (char *)0x0) {
      local_230 = 0xff;
      goto LAB_00113547;
    }
    local_248 = &stack0xfffffffffffffcd8;
    local_250 = &stack0x00000008;
    local_254 = 0x30;
    local_258 = 0x10;
    local_228 = local_220;
    local_230 = vsnprintf(local_220,(long)local_22c,local_10,&local_258);
  } while( true );
}

Assistant:

void
safe_fprintf(FILE *f, const char *fmt, ...)
{
	char fmtbuff_stack[256]; /* Place to format the printf() string. */
	char outbuff[256]; /* Buffer for outgoing characters. */
	char *fmtbuff_heap; /* If fmtbuff_stack is too small, we use malloc */
	char *fmtbuff;  /* Pointer to fmtbuff_stack or fmtbuff_heap. */
	int fmtbuff_length;
	int length, n;
	va_list ap;
	const char *p;
	unsigned i;
	wchar_t wc;
	char try_wc;

	/* Use a stack-allocated buffer if we can, for speed and safety. */
	fmtbuff_heap = NULL;
	fmtbuff_length = sizeof(fmtbuff_stack);
	fmtbuff = fmtbuff_stack;

	/* Try formatting into the stack buffer. */
	va_start(ap, fmt);
	length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
	va_end(ap);

	/* If the result was too large, allocate a buffer on the heap. */
	while (length < 0 || length >= fmtbuff_length) {
		if (length >= fmtbuff_length)
			fmtbuff_length = length+1;
		else if (fmtbuff_length < 8192)
			fmtbuff_length *= 2;
		else if (fmtbuff_length < 1000000)
			fmtbuff_length += fmtbuff_length / 4;
		else {
			length = fmtbuff_length;
			fmtbuff_heap[length-1] = '\0';
			break;
		}
		free(fmtbuff_heap);
		fmtbuff_heap = malloc(fmtbuff_length);

		/* Reformat the result into the heap buffer if we can. */
		if (fmtbuff_heap != NULL) {
			fmtbuff = fmtbuff_heap;
			va_start(ap, fmt);
			length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
			va_end(ap);
		} else {
			/* Leave fmtbuff pointing to the truncated
			 * string in fmtbuff_stack. */
			length = sizeof(fmtbuff_stack) - 1;
			break;
		}
	}

	/* Note: mbrtowc() has a cleaner API, but mbtowc() seems a bit
	 * more portable, so we use that here instead. */
	if (mbtowc(NULL, NULL, 1) == -1) { /* Reset the shift state. */
		/* mbtowc() should never fail in practice, but
		 * handle the theoretical error anyway. */
		free(fmtbuff_heap);
		return;
	}

	/* Write data, expanding unprintable characters. */
	p = fmtbuff;
	i = 0;
	try_wc = 1;
	while (*p != '\0') {

		/* Convert to wide char, test if the wide
		 * char is printable in the current locale. */
		if (try_wc && (n = mbtowc(&wc, p, length)) != -1) {
			length -= n;
			if (iswprint(wc) && wc != L'\\') {
				/* Printable, copy the bytes through. */
				while (n-- > 0)
					outbuff[i++] = *p++;
			} else {
				/* Not printable, format the bytes. */
				while (n-- > 0)
					i += (unsigned)bsdtar_expand_char(
					    outbuff, i, *p++);
			}
		} else {
			/* After any conversion failure, don't bother
			 * trying to convert the rest. */
			i += (unsigned)bsdtar_expand_char(outbuff, i, *p++);
			try_wc = 0;
		}

		/* If our output buffer is full, dump it and keep going. */
		if (i > (sizeof(outbuff) - 20)) {
			outbuff[i] = '\0';
			fprintf(f, "%s", outbuff);
			i = 0;
		}
	}
	outbuff[i] = '\0';
	fprintf(f, "%s", outbuff);

	/* If we allocated a heap-based formatting buffer, free it now. */
	free(fmtbuff_heap);
}